

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void glfwSetGamma(GLFWmonitor *handle,float gamma)

{
  float fVar1;
  float local_23c;
  undefined1 auStack_238 [4];
  float value;
  GLFWgammaramp ramp;
  unsigned_short values [256];
  int i;
  float gamma_local;
  GLFWmonitor *handle_local;
  
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("handle != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/monitor.c"
                  ,0x1af,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (NAN(gamma)) {
    __assert_fail("gamma == gamma",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/monitor.c"
                  ,0x1b0,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (gamma < 0.0) {
    __assert_fail("gamma >= 0.f",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/monitor.c"
                  ,0x1b1,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (3.4028235e+38 < gamma) {
    __assert_fail("gamma <= FLT_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/monitor.c"
                  ,0x1b2,"void glfwSetGamma(GLFWmonitor *, float)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((gamma <= 0.0) || (3.4028235e+38 < gamma)) {
    _glfwInputError(0x10004,"Invalid gamma value %f",(double)gamma);
  }
  else {
    values[0xfc] = 0;
    values[0xfd] = 0;
    for (; (int)values._504_4_ < 0x100; values._504_4_ = values._504_4_ + 1) {
      fVar1 = powf((float)(int)values._504_4_ / 255.0,1.0 / gamma);
      local_23c = fVar1 * 65535.0 + 0.5;
      if (65535.0 < local_23c) {
        local_23c = 65535.0;
      }
      values[(long)(int)values._504_4_ + -4] = (unsigned_short)(int)local_23c;
    }
    _auStack_238 = &ramp.size;
    ramp.red = (unsigned_short *)&ramp.size;
    ramp.green = (unsigned_short *)&ramp.size;
    ramp.blue._0_4_ = 0x100;
    glfwSetGammaRamp(handle,(GLFWgammaramp *)auStack_238);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetGamma(GLFWmonitor* handle, float gamma)
{
    int i;
    unsigned short values[256];
    GLFWgammaramp ramp;
    assert(handle != NULL);
    assert(gamma == gamma);
    assert(gamma >= 0.f);
    assert(gamma <= FLT_MAX);

    _GLFW_REQUIRE_INIT();

    if (gamma != gamma || gamma <= 0.f || gamma > FLT_MAX)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid gamma value %f", gamma);
        return;
    }

    for (i = 0;  i < 256;  i++)
    {
        float value;

        // Calculate intensity
        value = i / 255.f;
        // Apply gamma curve
        value = powf(value, 1.f / gamma) * 65535.f + 0.5f;

        // Clamp to value range
        if (value > 65535.f)
            value = 65535.f;

        values[i] = (unsigned short) value;
    }

    ramp.red = values;
    ramp.green = values;
    ramp.blue = values;
    ramp.size = 256;

    glfwSetGammaRamp(handle, &ramp);
}